

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O1

Action __thiscall
psy::C::SyntaxDumper::visitExtGNU_AttributeSpecifier
          (SyntaxDumper *this,ExtGNU_AttributeSpecifierSyntax *node)

{
  ExtGNU_AttributeListSyntax *pEVar1;
  SyntaxToken local_50;
  
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->attrKwTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->openOuterParenTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->openInnerParenTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  for (pEVar1 = node->attrs_; pEVar1 != (ExtGNU_AttributeListSyntax *)0x0;
      pEVar1 = (pEVar1->
               super_CoreSyntaxNodeList<psy::C::ExtGNU_AttributeSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AttributeSyntax_*>_>
               ).
               super_List<psy::C::ExtGNU_AttributeSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AttributeSyntax_*>_>
               .next) {
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])
              (this,(pEVar1->
                    super_CoreSyntaxNodeList<psy::C::ExtGNU_AttributeSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AttributeSyntax_*>_>
                    ).
                    super_List<psy::C::ExtGNU_AttributeSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AttributeSyntax_*>_>
                    .value);
  }
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->closeInnerParenTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->closeOuterParenTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  return Skip;
}

Assistant:

virtual Action visitExtGNU_AttributeSpecifier(const ExtGNU_AttributeSpecifierSyntax* node) override
    {
        terminal(node->attributeKeyword(), node);
        terminal(node->openOuterParenthesisToken(), node);
        terminal(node->openInnerParenthesisToken(), node);
        for (auto iter = node->attributes(); iter; iter = iter->next)
            nonterminal(iter->value);
        terminal(node->closeInnerParenthesisToken(), node);
        terminal(node->closeOuterParenthesisToken(), node);
        return Action::Skip;
    }